

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O3

void __thiscall amrex::MLEBABecLap::setEBHomogDirichlet(MLEBABecLap *this,int amrlev,MultiFab *beta)

{
  undefined8 uVar1;
  BoxArray *bxs;
  DistributionMapping *dm;
  FabFactory<amrex::FArrayBox> *pFVar2;
  pointer puVar3;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> tVar4;
  long lVar5;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> _Var6;
  __uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  _Var7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint ncomp;
  FabType FVar15;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> _Var16;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> this_00;
  pointer *ppbVar17;
  uint32_t *puVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  void *pvVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  bool bVar28;
  bool bVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  Periodicity PVar32;
  MFIter mfi;
  long local_278;
  long local_270;
  long local_268;
  long local_238;
  Box local_20c;
  FabArray<amrex::EBCellFlagFab> *local_1f0;
  Location local_1e4;
  long local_1e0;
  long local_1d8;
  ulong local_1d0;
  uint local_1c4;
  MLEBABecLap *local_1c0;
  Array4<double> local_1b8;
  FabArray<amrex::FArrayBox> *local_178;
  ulong local_170;
  undefined1 local_168 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_158;
  int local_140;
  Vector<int,_std::allocator<int>_> *local_128;
  Array4<const_double> local_108;
  Array4<const_amrex::EBCellFlag> local_c8;
  Array4<double> local_88;
  MFItInfo local_44;
  
  ncomp = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  local_1c4 = (beta->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  local_1e4 = this->m_phi_loc;
  local_178 = &beta->super_FabArray<amrex::FArrayBox>;
  if (local_1c4 != ncomp && local_1c4 != 1) {
    Assert_host("beta_ncomp == 1 || beta_ncomp == ncomp",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLEBABecLap.cpp"
                ,399,(char *)0x0);
  }
  lVar26 = (long)amrlev;
  local_1e0 = lVar26;
  if ((_Head_base<0UL,_amrex::MultiFab_*,_false>)
      *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
       &(this->m_eb_phi).
        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        .
        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar26]._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> ==
      (MultiFab *)0x0) {
    bxs = *(BoxArray **)
           &(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_grids.
            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
            .
            super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar26].
            super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>;
    dm = *(DistributionMapping **)
          &(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_dmap.
           super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar26].
           super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
           super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
    ;
    local_168._1_7_ = 0;
    local_168[0] = true;
    local_168._8_4_ = 0;
    local_168._12_4_ = 0;
    vStack_158.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_158.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_158.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pFVar2 = (FabFactory<amrex::FArrayBox> *)
             **(undefined8 **)
               &(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                .
                super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar26].
                super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                .
                super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
    ;
    _Var16.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (__uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)
         operator_new(0x180);
    MultiFab::MultiFab((MultiFab *)
                       _Var16.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,bxs,dm,ncomp,
                       (uint)(local_1e4 == CellCentroid),(MFInfo *)local_168,pFVar2);
    lVar26 = local_1e0;
    puVar3 = (this->m_eb_phi).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    tVar4.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
          &puVar3[local_1e0]._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    puVar3[local_1e0]._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> =
         _Var16.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
         super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    if (tVar4.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
      (**(code **)(*(long *)tVar4.
                            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                            .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 8))();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_158);
  }
  local_1d8 = lVar26 * 3;
  lVar21 = lVar26;
  local_1c0 = this;
  if ((**(long **)&(this->m_eb_b_coeffs).
                   super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar26].
                   super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
       == 0) &&
     (0 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels.
          super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar26])) {
    local_278 = 0;
    lVar20 = 0;
    lVar27 = 0;
    do {
      lVar21 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_grids.
                         super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar26].
                         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>;
      lVar5 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_dmap.
                        super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar26].
                        super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        .
                        super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
      ;
      local_168._1_7_ = 0;
      local_168[0] = true;
      vStack_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168._8_4_ = 0;
      local_168._12_4_ = 0;
      vStack_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pFVar2 = *(FabFactory<amrex::FArrayBox> **)
                (*(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                           super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar26].
                           super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                           .
                           super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                + lVar27 * 8);
      this_00._M_t.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
      _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true>)
           operator_new(0x180);
      MultiFab::MultiFab((MultiFab *)
                         this_00._M_t.
                         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                         .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                         (BoxArray *)(lVar21 + lVar20),(DistributionMapping *)(lVar5 + local_278),
                         ncomp,0,(MFInfo *)local_168,pFVar2);
      this = local_1c0;
      lVar21 = local_1e0;
      puVar3 = (&(((local_1c0->m_eb_b_coeffs).
                   super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ).
                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)[local_1d8];
      _Var6._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           *(tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)&puVar3[lVar27]._M_t;
      puVar3[lVar27]._M_t =
           this_00._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
      if ((__uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)
          _Var6._M_t.
          super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
          super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)0x0) {
        (**(code **)(*(long *)_Var6._M_t.
                              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                              .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 8))();
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_158);
      lVar27 = lVar27 + 1;
      lVar20 = lVar20 + 0x68;
      local_278 = local_278 + 0x10;
    } while (lVar27 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels.
                      super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[lVar21]);
  }
  _Var7._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
       *(tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
         *)&(&(((this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                .
                super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
              ).
              super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)[local_1d8]->_M_t;
  if ((__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       )_Var7._M_t.
        super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
        .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       )0x0) {
    local_1f0 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    local_1f0 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    lVar26 = __dynamic_cast(_Var7._M_t.
                            super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                            .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                            _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo,0);
    if (lVar26 != 0) {
      local_1f0 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar26 + 0xd8));
    }
  }
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.do_tiling = true;
  local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_44.tilesize.vect[2] = DAT_00810ec0;
  local_44.dynamic = true;
  local_44.device_sync = true;
  MFIter::MFIter((MFIter *)local_168,
                 (FabArrayBase *)
                 (this->m_eb_phi).
                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar21]._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
                 &local_44);
  if ((int)vStack_158.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_140) {
    local_1d0 = (ulong)ncomp;
    do {
      MFIter::tilebox(&local_20c,(MFIter *)local_168);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_88,
                 (FabArray<amrex::FArrayBox> *)
                 (this->m_eb_phi).
                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_1e0]._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
                 (MFIter *)local_168);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_1b8,
                 (FabArray<amrex::FArrayBox> *)
                 (&(((this->m_eb_b_coeffs).
                     super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   ).
                   super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)[local_1d8]->_M_t,(MFIter *)local_168);
      if (local_1f0 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
        if (0 < (int)ncomp) {
          bVar28 = true;
          goto LAB_006c77f5;
        }
      }
      else {
        ppbVar17 = &vStack_158.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (local_128 != (Vector<int,_std::allocator<int>_> *)0x0) {
          ppbVar17 = (pointer *)
                     ((local_128->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start +
                     (int)vStack_158.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        FVar15 = EBCellFlagFab::getType
                           ((local_1f0->m_fabs_v).
                            super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar17],&local_20c);
        bVar28 = (uint)(FVar15 + singlevalued) < 2;
        if ((int)ncomp < 1) {
          if ((uint)(FVar15 + singlevalued) < 2) goto LAB_006c7f4d;
        }
        else {
LAB_006c77f5:
          iVar14 = local_20c.bigend.vect[2];
          iVar13 = local_20c.bigend.vect[1];
          iVar12 = local_20c.bigend.vect[0];
          iVar11 = local_20c.smallend.vect[2];
          iVar10 = local_20c.smallend.vect[1];
          iVar9 = local_20c.smallend.vect[0];
          lVar21 = (long)local_20c.smallend.vect[0];
          lVar26 = (long)local_20c.smallend.vect[1];
          uVar22 = local_20c.bigend.vect[0] - local_20c.smallend.vect[0];
          iVar23 = (local_20c.bigend.vect[1] - local_20c.smallend.vect[1]) + 1;
          local_268 = 0;
          uVar19 = 0;
          do {
            iVar8 = iVar11;
            if (iVar11 <= iVar14) {
              do {
                if (iVar10 <= iVar13) {
                  lVar20 = local_88.jstride * 8;
                  pvVar24 = (void *)((long)local_88.p +
                                    local_88.nstride * local_268 +
                                    (lVar26 - local_88.begin.y) * lVar20 +
                                    (iVar8 - local_88.begin.z) * local_88.kstride * 8 +
                                    (long)local_88.begin.x * -8 + lVar21 * 8);
                  iVar25 = iVar23;
                  do {
                    if (iVar9 <= iVar12) {
                      memset(pvVar24,0,(ulong)uVar22 * 8 + 8);
                    }
                    pvVar24 = (void *)((long)pvVar24 + lVar20);
                    iVar25 = iVar25 + -1;
                  } while (iVar25 != 0);
                }
                bVar29 = iVar8 != iVar14;
                iVar8 = iVar8 + 1;
              } while (bVar29);
            }
            uVar19 = uVar19 + 1;
            local_268 = local_268 + 8;
          } while (uVar19 != local_1d0);
          if (bVar28) {
            if (0 < (int)ncomp) {
              local_268 = 0;
              uVar19 = 0;
              do {
                iVar8 = iVar11;
                if (iVar11 <= iVar14) {
                  do {
                    if (iVar10 <= iVar13) {
                      lVar20 = local_1b8.jstride * 8;
                      pvVar24 = (void *)((long)local_1b8.p +
                                        local_1b8.nstride * local_268 +
                                        (lVar26 - local_1b8.begin.y) * lVar20 +
                                        (iVar8 - local_1b8.begin.z) * local_1b8.kstride * 8 +
                                        (long)local_1b8.begin.x * -8 + lVar21 * 8);
                      iVar25 = iVar23;
                      do {
                        if (iVar9 <= iVar12) {
                          memset(pvVar24,0,(ulong)uVar22 * 8 + 8);
                        }
                        pvVar24 = (void *)((long)pvVar24 + lVar20);
                        iVar25 = iVar25 + -1;
                      } while (iVar25 != 0);
                    }
                    bVar28 = iVar8 != iVar14;
                    iVar8 = iVar8 + 1;
                  } while (bVar28);
                }
                uVar19 = uVar19 + 1;
                local_268 = local_268 + 8;
              } while (uVar19 != local_1d0);
            }
            goto LAB_006c7f4d;
          }
        }
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_108,local_178,(MFIter *)local_168);
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (&local_c8,local_1f0,(MFIter *)local_168);
        if (local_1c4 == ncomp) {
          if (0 < (int)ncomp) {
            lVar26 = (long)local_20c.smallend.vect[0] * 8;
            local_238 = 0;
            uVar19 = 0;
            do {
              local_170 = uVar19;
              iVar9 = local_20c.smallend.vect[2];
              if (local_20c.smallend.vect[2] <= local_20c.bigend.vect[2]) {
                do {
                  if (local_20c.smallend.vect[1] <= local_20c.bigend.vect[1]) {
                    lVar20 = (long)iVar9;
                    puVar18 = (uint32_t *)
                              ((long)&local_c8.p
                                      [(long)local_20c.smallend.vect[0] +
                                       ((lVar20 - local_c8.begin.z) * local_c8.kstride -
                                       (long)local_c8.begin.x)].flag +
                              ((long)local_20c.smallend.vect[1] - (long)local_c8.begin.y) *
                              local_c8.jstride * 4);
                    lVar21 = (long)local_20c.smallend.vect[1];
                    do {
                      if (local_20c.smallend.vect[0] <= local_20c.bigend.vect[0]) {
                        lVar27 = 0;
                        do {
                          uVar30 = 0;
                          uVar31 = 0;
                          if ((puVar18[lVar27] & 3) == 1) {
                            uVar1 = *(undefined8 *)
                                     ((long)local_108.p +
                                     lVar27 * 8 +
                                     local_108.nstride * local_238 +
                                     (lVar20 - local_108.begin.z) * local_108.kstride * 8 +
                                     (lVar21 - local_108.begin.y) * local_108.jstride * 8 +
                                     (long)local_108.begin.x * -8 + lVar26);
                            uVar30 = (undefined4)uVar1;
                            uVar31 = (undefined4)((ulong)uVar1 >> 0x20);
                          }
                          *(ulong *)((long)local_1b8.p +
                                    lVar27 * 8 +
                                    local_1b8.nstride * local_238 +
                                    (lVar20 - local_1b8.begin.z) * local_1b8.kstride * 8 +
                                    (lVar21 - local_1b8.begin.y) * local_1b8.jstride * 8 +
                                    (long)local_1b8.begin.x * -8 + lVar26) = CONCAT44(uVar31,uVar30)
                          ;
                          lVar27 = lVar27 + 1;
                        } while ((local_20c.bigend.vect[0] - local_20c.smallend.vect[0]) + 1 !=
                                 (int)lVar27);
                      }
                      lVar21 = lVar21 + 1;
                      puVar18 = puVar18 + local_c8.jstride;
                    } while (local_20c.bigend.vect[1] + 1 != (int)lVar21);
                  }
                  bVar28 = iVar9 != local_20c.bigend.vect[2];
                  iVar9 = iVar9 + 1;
                } while (bVar28);
              }
              local_238 = local_238 + 8;
              uVar19 = local_170 + 1;
            } while (local_170 + 1 != local_1d0);
          }
        }
        else if (0 < (int)ncomp) {
          lVar26 = (long)local_20c.smallend.vect[0];
          local_270 = 0;
          uVar19 = 0;
          do {
            iVar9 = local_20c.smallend.vect[2];
            if (local_20c.smallend.vect[2] <= local_20c.bigend.vect[2]) {
              do {
                if (local_20c.smallend.vect[1] <= local_20c.bigend.vect[1]) {
                  lVar20 = (long)iVar9;
                  puVar18 = (uint32_t *)
                            ((long)&local_c8.p
                                    [lVar26 + ((lVar20 - local_c8.begin.z) * local_c8.kstride -
                                              (long)local_c8.begin.x)].flag +
                            ((long)local_20c.smallend.vect[1] - (long)local_c8.begin.y) *
                            local_c8.jstride * 4);
                  lVar21 = (long)local_20c.smallend.vect[1];
                  do {
                    if (local_20c.smallend.vect[0] <= local_20c.bigend.vect[0]) {
                      lVar27 = 0;
                      do {
                        uVar30 = 0;
                        uVar31 = 0;
                        if ((puVar18[lVar27] & 3) == 1) {
                          uVar30 = SUB84(local_108.p
                                         [lVar26 + (((lVar21 - local_108.begin.y) *
                                                     local_108.jstride +
                                                    (lVar20 - local_108.begin.z) * local_108.kstride
                                                    + lVar27) - (long)local_108.begin.x)],0);
                          uVar31 = (undefined4)
                                   ((ulong)local_108.p
                                           [lVar26 + (((lVar21 - local_108.begin.y) *
                                                       local_108.jstride +
                                                      (lVar20 - local_108.begin.z) *
                                                      local_108.kstride + lVar27) -
                                                     (long)local_108.begin.x)] >> 0x20);
                        }
                        *(ulong *)((long)local_1b8.p +
                                  lVar27 * 8 +
                                  local_1b8.nstride * local_270 +
                                  (lVar20 - local_1b8.begin.z) * local_1b8.kstride * 8 +
                                  (lVar21 - local_1b8.begin.y) * local_1b8.jstride * 8 +
                                  (long)local_1b8.begin.x * -8 + lVar26 * 8) =
                             CONCAT44(uVar31,uVar30);
                        lVar27 = lVar27 + 1;
                      } while ((local_20c.bigend.vect[0] - local_20c.smallend.vect[0]) + 1 !=
                               (int)lVar27);
                    }
                    lVar21 = lVar21 + 1;
                    puVar18 = puVar18 + local_c8.jstride;
                  } while (local_20c.bigend.vect[1] + 1 != (int)lVar21);
                }
                bVar28 = iVar9 != local_20c.bigend.vect[2];
                iVar9 = iVar9 + 1;
              } while (bVar28);
            }
            uVar19 = uVar19 + 1;
            local_270 = local_270 + 8;
          } while (uVar19 != local_1d0);
        }
      }
LAB_006c7f4d:
      MFIter::operator++((MFIter *)local_168);
      this = local_1c0;
    } while ((int)vStack_158.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_140);
  }
  MFIter::~MFIter((MFIter *)local_168);
  if (local_1e4 == CellCentroid) {
    _Var16.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->m_eb_phi).
         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[local_1e0]._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    PVar32 = Geometry::periodicity
                       ((&(((this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                            super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          _M_impl.super__Vector_impl_data._M_start)[local_1d8]);
    local_168[0] = PVar32.period.vect[0]._0_1_;
    local_168._1_7_ = PVar32.period.vect._1_7_;
    local_168._8_4_ = PVar32.period.vect[2];
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              ((FabArray<amrex::FArrayBox> *)
               _Var16.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
               _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
               .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
               (Periodicity *)local_168,false);
  }
  return;
}

Assistant:

void
MLEBABecLap::setEBHomogDirichlet (int amrlev, const MultiFab& beta)
{
    const int ncomp = getNComp();
    const int beta_ncomp = beta.nComp();
    bool phi_on_centroid = (m_phi_loc == Location::CellCentroid);
    AMREX_ALWAYS_ASSERT(beta_ncomp == 1 || beta_ncomp == ncomp);
    if (m_eb_phi[amrlev] == nullptr) {
        const int mglev = 0;
        const int ngrow = phi_on_centroid ? 1 : 0;
        m_eb_phi[amrlev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                      m_dmap[amrlev][mglev],
                                                      ncomp, ngrow, MFInfo(),
                                                      *m_factory[amrlev][mglev]);
    }
    if (m_eb_b_coeffs[amrlev][0] == nullptr) {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev) {
            m_eb_b_coeffs[amrlev][mglev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                                      m_dmap[amrlev][mglev],
                                                                      ncomp, 0, MFInfo(),
                                                                      *m_factory[amrlev][mglev]);
        }
    }

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*m_eb_phi[amrlev], mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& phifab = m_eb_phi[amrlev]->array(mfi);
        Array4<Real> const& betaout = m_eb_b_coeffs[amrlev][0]->array(mfi);
        FabType t = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
        {
            phifab(i,j,k,n) = 0.0;
        });
        if (FabType::regular == t || FabType::covered == t) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                betaout(i,j,k,n) = 0.0;
            });
        } else {
            Array4<Real const> const& betain = beta.const_array(mfi);
            const auto& flag = flags->const_array(mfi);
            if (beta_ncomp == ncomp) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                {
                    if (flag(i,j,k).isSingleValued()) {
                        betaout(i,j,k,n) = betain(i,j,k,n);
                    } else {
                        betaout(i,j,k,n) = 0.0;
                    }
                });
            } else {
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                {
                    if (flag(i,j,k).isSingleValued()) {
                        betaout(i,j,k,n) = betain(i,j,k,0);
                    } else {
                        betaout(i,j,k,n) = 0.0;
                    }
                });
            }
        }
    }

    if (phi_on_centroid)
      m_eb_phi[amrlev]->FillBoundary(m_geom[amrlev][0].periodicity());
}